

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)0>::decode0
          (Predecoder<(InstructionSet::M68k::Model)0> *this,uint16_t instruction)

{
  uint uVar1;
  Preinstruction PVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = (uint)instruction;
  uVar1 = uVar6 & 0xfff;
  uVar4 = 0x60;
  uVar5 = 0x68;
  uVar3 = 0;
  if (0x27b < uVar1) {
    if (uVar1 == 0x27c) {
      PVar2.operation = ANDItoSR;
      PVar2.operands_[0] = '\0';
      PVar2.operands_[1] = '\0';
      PVar2.flags_ = '\0';
    }
    else {
      if (uVar1 == 0xa3c) {
        PVar2.operation = EORItoCCR;
        PVar2.operands_[0] = '\0';
        PVar2.operands_[1] = '\0';
        PVar2.flags_ = '\0';
        goto LAB_001d46bf;
      }
      if (uVar1 != 0xa7c) goto LAB_001d4534;
      PVar2.operation = EORItoSR;
      PVar2.operands_[0] = '\0';
      PVar2.operands_[1] = '\0';
      PVar2.flags_ = '\0';
    }
LAB_001d4567:
    uVar3 = 0x81000000;
    goto LAB_001d46bf;
  }
  if (uVar1 == 0x3c) {
    PVar2.operation = ORItoCCR;
    PVar2.operands_[0] = '\0';
    PVar2.operands_[1] = '\0';
    PVar2.flags_ = '\0';
    goto LAB_001d46bf;
  }
  if (uVar1 == 0x7c) {
    PVar2.operation = ORItoSR;
    PVar2.operands_[0] = '\0';
    PVar2.operands_[1] = '\0';
    PVar2.flags_ = '\0';
    goto LAB_001d4567;
  }
  if (uVar1 == 0x23c) {
    PVar2.operation = ANDItoCCR;
    PVar2.operands_[0] = '\0';
    PVar2.operands_[1] = '\0';
    PVar2.flags_ = '\0';
    uVar3 = 0;
    goto LAB_001d46bf;
  }
LAB_001d4534:
  switch(instruction >> 6 & 0x3f) {
  case 0:
    PVar2 = decode<(unsigned_char)155,true>(this,instruction);
    break;
  case 1:
    PVar2 = decode<(unsigned_char)156,true>(this,instruction);
    break;
  case 2:
    PVar2 = decode<(unsigned_char)157,true>(this,instruction);
    break;
  default:
    uVar3 = (uVar6 & 0x1f8) - 0x108;
    switch(uVar3 * 0x4000000 | uVar3 >> 6) {
    case 0:
      uVar4 = uVar6 & 7 | 0x28;
      uVar5 = instruction >> 9 & 7;
      break;
    case 1:
      uVar4 = uVar6 & 7 | 0x28;
      uVar5 = instruction >> 9 & 7;
      goto LAB_001d4713;
    case 2:
      uVar4 = instruction >> 9 & 7;
      uVar5 = uVar6 & 7 | 0x28;
      break;
    case 3:
      uVar4 = instruction >> 9 & 7;
      uVar5 = uVar6 & 7 | 0x28;
LAB_001d4713:
      PVar2.operation = MOVEPl;
      PVar2.operands_[0] = '\0';
      PVar2.operands_[1] = '\0';
      PVar2.flags_ = '\0';
      uVar3 = 0x2000000;
      goto LAB_001d46bf;
    default:
      switch((uVar6 & 0x1c0) - 0x100 >> 6) {
      case 0:
        PVar2 = decode<(unsigned_char)39,true>(this,instruction);
        break;
      case 1:
        PVar2 = decode<(unsigned_char)41,true>(this,instruction);
        break;
      case 2:
        PVar2 = decode<(unsigned_char)40,true>(this,instruction);
        break;
      case 3:
        PVar2 = decode<(unsigned_char)42,true>(this,instruction);
        break;
      default:
        uVar5 = 0xd;
        uVar3 = 0;
        uVar4 = 0xd;
        PVar2.operation = Undefined;
        PVar2.operands_[0] = '\0';
        PVar2.operands_[1] = '\0';
        PVar2.flags_ = '\0';
        goto LAB_001d46bf;
      }
      goto LAB_001d46ab;
    }
    PVar2.operation = MOVEPw;
    PVar2.operands_[0] = '\0';
    PVar2.operands_[1] = '\0';
    PVar2.flags_ = '\0';
    uVar3 = 0x1000000;
    goto LAB_001d46bf;
  case 8:
    PVar2 = decode<(unsigned_char)161,true>(this,instruction);
    break;
  case 9:
    PVar2 = decode<(unsigned_char)162,true>(this,instruction);
    break;
  case 10:
    PVar2 = decode<(unsigned_char)163,true>(this,instruction);
    break;
  case 0x10:
    PVar2 = decode<(unsigned_char)158,true>(this,instruction);
    break;
  case 0x11:
    PVar2 = decode<(unsigned_char)159,true>(this,instruction);
    break;
  case 0x12:
    PVar2 = decode<(unsigned_char)160,true>(this,instruction);
    break;
  case 0x18:
    PVar2 = decode<(unsigned_char)152,true>(this,instruction);
    break;
  case 0x19:
    PVar2 = decode<(unsigned_char)153,true>(this,instruction);
    break;
  case 0x1a:
    PVar2 = decode<(unsigned_char)154,true>(this,instruction);
    break;
  case 0x20:
    PVar2 = decode<(unsigned_char)170,true>(this,instruction);
    break;
  case 0x21:
    PVar2 = decode<(unsigned_char)171,true>(this,instruction);
    break;
  case 0x22:
    PVar2 = decode<(unsigned_char)172,true>(this,instruction);
    break;
  case 0x23:
    PVar2 = decode<(unsigned_char)173,true>(this,instruction);
    break;
  case 0x28:
    PVar2 = decode<(unsigned_char)164,true>(this,instruction);
    break;
  case 0x29:
    PVar2 = decode<(unsigned_char)165,true>(this,instruction);
    break;
  case 0x2a:
    PVar2 = decode<(unsigned_char)166,true>(this,instruction);
    break;
  case 0x30:
    PVar2 = decode<(unsigned_char)167,true>(this,instruction);
    break;
  case 0x31:
    PVar2 = decode<(unsigned_char)168,true>(this,instruction);
    break;
  case 0x32:
    PVar2 = decode<(unsigned_char)169,true>(this,instruction);
  }
LAB_001d46ab:
  uVar4 = (uint)PVar2 >> 8;
  uVar5 = (uint)PVar2 >> 0x10;
  uVar3 = (uint)PVar2 & 0xff000000;
LAB_001d46bf:
  return (Preinstruction)((uint)PVar2 & 0xff | (uVar4 & 0xff) << 8 | (uVar5 & 0xff) << 0x10 | uVar3)
  ;
}

Assistant:

Preinstruction Predecoder<model>::decode0(uint16_t instruction) {
	using Op = Operation;

	switch(instruction & 0xfff) {
		case 0x03c:	Decode(Op::ORItoCCR);	// 4-155 (p259)
		case 0x07c:	Decode(Op::ORItoSR);	// 6-27 (p481)
		case 0x23c:	Decode(Op::ANDItoCCR);	// 4-20 (p124)
		case 0x27c:	Decode(Op::ANDItoSR);	// 6-2 (p456)
		case 0xa3c:	Decode(Op::EORItoCCR);	// 4-104 (p208)
		case 0xa7c:	Decode(Op::EORItoSR);	// 6-10 (p464)

		// 4-68 (p172)
		case 0xcfc:	DecodeReq(model >= Model::M68020, Op::CAS2w);
		case 0xefc:	DecodeReq(model >= Model::M68020, Op::CAS2l);

		default:	break;
	}

	switch(instruction & 0xff0) {
		case 0x6c0:	DecodeReq(model == Model::M68020, Op::RTM);	// 4-167 (p271)

		default:	break;
	}

	switch(instruction & 0xfc0) {
		// 4-153 (p257)
		case 0x000:	Decode(ORIb);
		case 0x040:	Decode(ORIw);
		case 0x080:	Decode(ORIl);

		// 4-18 (p122)
		case 0x200:	Decode(ANDIb);
		case 0x240:	Decode(ANDIw);
		case 0x280:	Decode(ANDIl);

		// 4-179 (p283)
		case 0x400:	Decode(SUBIb);
		case 0x440:	Decode(SUBIw);
		case 0x480:	Decode(SUBIl);

		// 4-9 (p113)
		case 0x600:	Decode(ADDIb);
		case 0x640:	Decode(ADDIw);
		case 0x680:	Decode(ADDIl);

		// 4-63 (p167)
		case 0x800:	Decode(BTSTI);

		// 4-29 (p133)
		case 0x840:	Decode(BCHGI);

		// 4-32 (p136)
		case 0x880:	Decode(BCLRI);

		// 4-58 (p162)
		case 0x8c0:	Decode(BSETI);

		// 4-102 (p206)
		case 0xa00:	Decode(EORIb);
		case 0xa40:	Decode(EORIw);
		case 0xa80:	Decode(EORIl);

		// 4-79 (p183)
		case 0xc00:	Decode(CMPIb);
		case 0xc40:	Decode(CMPIw);
		case 0xc80:	Decode(CMPIl);

		// 4-64 (p168)
		case 0x6c0: DecodeReq(model == Model::M68020, Op::CALLM);

		// 4-67 (p171)
		case 0xac0:	DecodeReq(model >= Model::M68020, Op::CASb);
		case 0xcc0:	DecodeReq(model >= Model::M68020, Op::CASw);
		case 0xec0:	DecodeReq(model >= Model::M68020, Op::CASl);

		// 4-83 (p187) [CMP2] and 4-72 (p176) [CHK2];
		// the two are distinguished by a bit in the extension word.
		case 0x0c0:	DecodeReq(model >= Model::M68020, Op::CHKorCMP2b);
		case 0x2c0:	DecodeReq(model >= Model::M68020, Op::CHKorCMP2b);
		case 0x4c0:	DecodeReq(model >= Model::M68020, Op::CHKorCMP2b);

		// 6-24 (p478)
		case 0xe00: DecodeReq(model >= Model::M68010, Op::MOVESb);
		case 0xe40: DecodeReq(model >= Model::M68010, Op::MOVESw);
		case 0xe80: DecodeReq(model >= Model::M68010, Op::MOVESl);

		default:	break;
	}

	switch(instruction & 0x1f8) {
		// 4-133 (p237)
		case 0x108:	Decode(MOVEPtoRw);
		case 0x148:	Decode(MOVEPtoRl);
		case 0x188:	Decode(MOVEPtoMw);
		case 0x1c8:	Decode(MOVEPtoMl);

		default:	break;
	}

	switch(instruction & 0x1c0) {
		case 0x100:	Decode(Op::BTST);	// 4-62 (p166)
		case 0x180:	Decode(Op::BCLR);	// 4-31 (p135)

		case 0x140:	Decode(Op::BCHG);	// 4-28 (p132)
		case 0x1c0:	Decode(Op::BSET);	// 4-57 (p161)

		default:	break;
	}

	return Preinstruction();
}